

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O3

void __thiscall
Jupiter::IRC::Client::Channel::Channel(Channel *this,string_view in_name,Client *in_parent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Config *pCVar3;
  const_iterator cVar4;
  size_type sVar5;
  size_type __len2;
  string_view in_key;
  string_view in_key_00;
  string_view in_key_01;
  string_view in_key_02;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __len2 = in_name._M_len;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_users)._M_h._M_buckets = &(this->m_users)._M_h._M_single_bucket;
  (this->m_users)._M_h._M_bucket_count = 1;
  (this->m_users)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_users)._M_h._M_element_count = 0;
  (this->m_users)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_users)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_users)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_name,0,0,in_name._M_str,__len2);
  this->m_parent = in_parent;
  this->m_type = in_parent->m_default_chan_type;
  paVar1 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar1;
  if (__len2 != 0) {
    sVar5 = 0;
    do {
      iVar2 = tolower((int)in_name._M_str[sVar5]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_60,(char)iVar2);
      sVar5 = sVar5 + 1;
    } while (__len2 != sVar5);
    in_parent = this->m_parent;
  }
  if (in_parent->m_secondary_section != (Config *)0x0) {
    iVar2 = this->m_type;
    in_key._M_str = "Channels";
    in_key._M_len = 8;
    pCVar3 = Config::operator[](in_parent->m_secondary_section,in_key);
    in_key_00._M_str = local_60._M_dataplus._M_p;
    in_key_00._M_len = local_60._M_string_length;
    pCVar3 = Config::operator[](pCVar3,in_key_00);
    local_40._M_len = 4;
    local_40._M_str = "Type";
    cVar4 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pCVar3->m_table,&local_40);
    if (cVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      iVar2 = Jupiter_strtoi_s(*(char **)((long)cVar4.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                ._M_cur + 0x28),
                               *(size_t *)
                                ((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x30),0);
    }
    this->m_type = iVar2;
    in_parent = this->m_parent;
  }
  if (in_parent->m_primary_section != (Config *)0x0) {
    iVar2 = this->m_type;
    in_key_01._M_str = "Channels";
    in_key_01._M_len = 8;
    pCVar3 = Config::operator[](in_parent->m_primary_section,in_key_01);
    in_key_02._M_str = local_60._M_dataplus._M_p;
    in_key_02._M_len = local_60._M_string_length;
    pCVar3 = Config::operator[](pCVar3,in_key_02);
    local_40._M_len = 4;
    local_40._M_str = "Type";
    cVar4 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pCVar3->m_table,&local_40);
    if (cVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      iVar2 = Jupiter_strtoi_s(*(char **)((long)cVar4.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                ._M_cur + 0x28),
                               *(size_t *)
                                ((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x30),0);
    }
    this->m_type = iVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

Jupiter::IRC::Client::Channel::Channel(std::string_view in_name, Jupiter::IRC::Client *in_parent) {
	// TODO: remove this
	auto to_lower = [&in_name]() {
		std::string result;
		const char *itr = in_name.data();
		const char *end = itr + in_name.size();

		while (itr != end)
		{
			result += static_cast<char>(tolower(*itr));
			++itr;
		}

		return result;
	};

	m_name = in_name;
	m_parent = in_parent;
	m_type = m_parent->getDefaultChanType();

	std::string name = to_lower();

	auto read_type = [&name](Jupiter::Config &in_config, int default_type) {
		return in_config["Channels"sv][name].get<int>("Type"sv, default_type);
	};

	if (m_parent->getSecondaryConfigSection() != nullptr)
		m_type = read_type(*m_parent->getSecondaryConfigSection(), m_type);

	if (m_parent->getPrimaryConfigSection() != nullptr)
		m_type = read_type(*m_parent->getPrimaryConfigSection(), m_type);
}